

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comex.c
# Opt level: O0

int comex_gets(void *src_ptr,int *src_stride_ar,void *dst_ptr,int *dst_stride_ar,int *count,
              int stride_levels,int proc,comex_group_t group)

{
  int iVar1;
  long in_RCX;
  long in_RSI;
  long in_R8;
  int in_R9D;
  int world_proc;
  int ierr;
  int size;
  int dst_bunit [7];
  int dst_bvalue [7];
  int src_bunit [7];
  int src_bvalue [7];
  int n1dim;
  long dst_idx;
  long src_idx;
  int j;
  int i;
  int in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff2c;
  int in_stack_ffffffffffffff34;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 uVar2;
  undefined4 in_stack_ffffffffffffff3c;
  undefined4 uVar3;
  int in_stack_ffffffffffffff40;
  comex_group_t in_stack_ffffffffffffff44;
  int local_a8 [8];
  int local_88 [8];
  int local_68 [7];
  int local_4c;
  long local_48;
  long local_40;
  int local_34;
  int local_30;
  int local_2c;
  long local_28;
  long local_20;
  long local_10;
  
  local_2c = in_R9D;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_10 = in_RSI;
  iVar1 = comex_group_size(in_stack_ffffffffffffff44,
                           (int *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  if (iVar1 != 0) {
    __assert_fail("COMEX_SUCCESS == ierr",
                  "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-mpi/comex.c"
                  ,0x359,
                  "int comex_gets(void *, int *, void *, int *, int *, int, int, comex_group_t)");
  }
  if (-1 < ierr) {
    if (ierr < in_stack_ffffffffffffff34) {
      if (dst_bunit[0] != 0) {
        comex_group_translate_world
                  (in_stack_ffffffffffffff44,in_stack_ffffffffffffff40,
                   (int *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
      }
      local_4c = 1;
      for (local_30 = 1; local_30 <= local_2c; local_30 = local_30 + 1) {
        local_4c = *(int *)(local_28 + (long)local_30 * 4) * local_4c;
      }
      local_68[0] = 0;
      local_68[1] = 0;
      local_88[0] = 1;
      local_88[1] = 1;
      local_a8[0] = 0;
      local_a8[1] = 0;
      uVar2 = 1;
      uVar3 = 1;
      for (local_30 = 2; local_30 <= local_2c; local_30 = local_30 + 1) {
        local_68[local_30] = 0;
        local_a8[local_30] = 0;
        local_88[local_30] =
             local_88[local_30 + -1] * *(int *)(local_28 + (long)(local_30 + -1) * 4);
        *(int *)(&stack0xffffffffffffff38 + (long)local_30 * 4) =
             *(int *)(&stack0xffffffffffffff38 + (long)(local_30 + -1) * 4) *
             *(int *)(local_28 + (long)(local_30 + -1) * 4);
      }
      for (local_30 = 0; local_30 < local_4c; local_30 = local_30 + 1) {
        local_40 = 0;
        for (local_34 = 1; local_34 <= local_2c; local_34 = local_34 + 1) {
          local_40 = (long)local_68[local_34] * (long)*(int *)(local_10 + (long)(local_34 + -1) * 4)
                     + local_40;
          if ((local_30 + 1) % local_88[local_34] == 0) {
            local_68[local_34] = local_68[local_34] + 1;
          }
          if (*(int *)(local_28 + (long)local_34 * 4) + -1 < local_68[local_34]) {
            local_68[local_34] = 0;
          }
        }
        local_48 = 0;
        for (local_34 = 1; local_34 <= local_2c; local_34 = local_34 + 1) {
          local_48 = (long)local_a8[local_34] * (long)*(int *)(local_20 + (long)(local_34 + -1) * 4)
                     + local_48;
          if ((local_30 + 1) % *(int *)(&stack0xffffffffffffff38 + (long)local_34 * 4) == 0) {
            local_a8[local_34] = local_a8[local_34] + 1;
          }
          if (*(int *)(local_28 + (long)local_34 * 4) + -1 < local_a8[local_34]) {
            local_a8[local_34] = 0;
          }
        }
        _get_nbi((void *)CONCAT44(uVar3,uVar2),(void *)CONCAT44(in_stack_ffffffffffffff34,iVar1),
                 in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28);
      }
      comex_wait_proc(0,0x10d353);
      return 0;
    }
    __assert_fail("proc < size",
                  "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-mpi/comex.c"
                  ,0x359,
                  "int comex_gets(void *, int *, void *, int *, int *, int, int, comex_group_t)");
  }
  __assert_fail("proc >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-mpi/comex.c"
                ,0x359,
                "int comex_gets(void *, int *, void *, int *, int *, int, int, comex_group_t)");
}

Assistant:

int comex_gets(
        void *src_ptr, int *src_stride_ar,
        void *dst_ptr, int *dst_stride_ar,
        int *count, int stride_levels,
        int proc, comex_group_t group)
{
    int i, j;
    long src_idx, dst_idx;  /* index offset of current block position to ptr */
    int n1dim;  /* number of 1 dim block */
    int src_bvalue[7], src_bunit[7];
    int dst_bvalue[7], dst_bunit[7];

    CHECK_GROUP(group,proc);
#if DEBUG
    if (stride_levels) {
        printf("[%d] comex_gets(src_ptr=%p, src_stride_ar[0]=%d, dst_ptr=%p, dst_stride_ar[0]=%d, count[0]=%d, stride_levels=%d, proc=%d)\n",
                l_state.rank, src_ptr, src_stride_ar[0], dst_ptr, dst_stride_ar[0], count[0], stride_levels, proc);
    }
    else {
        printf("[%d] comex_gets(src_ptr=%p, src_stride_ar=NULL, dst_ptr=%p, dst_stride_ar=NULL, count=NULL, stride_levels=%d, proc=%d)\n",
                l_state.rank, src_ptr, dst_ptr, stride_levels, proc);
    }
#endif

    /* number of n-element of the first dimension */
    n1dim = 1;
    for(i=1; i<=stride_levels; i++) {
        n1dim *= count[i];
    }

    /* calculate the destination indices */
    src_bvalue[0] = 0; src_bvalue[1] = 0; src_bunit[0] = 1; src_bunit[1] = 1;
    dst_bvalue[0] = 0; dst_bvalue[1] = 0; dst_bunit[0] = 1; dst_bunit[1] = 1;

    for(i=2; i<=stride_levels; i++) {
        src_bvalue[i] = 0;
        dst_bvalue[i] = 0;
        src_bunit[i] = src_bunit[i-1] * count[i-1];
        dst_bunit[i] = dst_bunit[i-1] * count[i-1];
    }

    for(i=0; i<n1dim; i++) {
        src_idx = 0;
        for(j=1; j<=stride_levels; j++) {
	  src_idx += (long) src_bvalue[j] * (long) src_stride_ar[j-1];
            if((i+1) % src_bunit[j] == 0) {
                src_bvalue[j]++;
            }
            if(src_bvalue[j] > (count[j]-1)) {
                src_bvalue[j] = 0;
            }
        }

        dst_idx = 0;
        
        for(j=1; j<=stride_levels; j++) {
	  dst_idx += (long) dst_bvalue[j] * (long) dst_stride_ar[j-1];
            if((i+1) % dst_bunit[j] == 0) {
                dst_bvalue[j]++;
            }
            if(dst_bvalue[j] > (count[j]-1)) {
                dst_bvalue[j] = 0;
            }
        }
        
        _get_nbi((char *)src_ptr + src_idx, 
                (char *)dst_ptr + dst_idx, count[0], proc);
    }
    
    comex_wait_proc(proc, group);
    
    return COMEX_SUCCESS;
}